

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O1

void __thiscall
soul::heart::Printer::PrinterStream::printStatementDescription(PrinterStream *this,Object *s)

{
  AssignFromValue *a;
  FunctionCall *f;
  ReadStream *r;
  WriteStream *w;
  long lVar1;
  Branch *b;
  BranchIf *b_00;
  ReturnValue *r_00;
  char *pcVar2;
  size_t sVar3;
  CodePrinter *this_00;
  string_view text;
  
  a = (AssignFromValue *)__dynamic_cast(s,&Object::typeinfo,&AssignFromValue::typeinfo,0);
  if (a != (AssignFromValue *)0x0) {
    printDescription(this,a);
    return;
  }
  f = (FunctionCall *)__dynamic_cast(s,&Object::typeinfo,&FunctionCall::typeinfo,0);
  if (f != (FunctionCall *)0x0) {
    printDescription(this,f);
    return;
  }
  r = (ReadStream *)__dynamic_cast(s,&Object::typeinfo,&ReadStream::typeinfo,0);
  if (r != (ReadStream *)0x0) {
    printDescription(this,r);
    return;
  }
  w = (WriteStream *)__dynamic_cast(s,&Object::typeinfo,&WriteStream::typeinfo,0);
  if (w != (WriteStream *)0x0) {
    printDescription(this,w);
    return;
  }
  lVar1 = __dynamic_cast(s,&Object::typeinfo,&AdvanceClock::typeinfo,0);
  if (lVar1 == 0) {
    b = (Branch *)__dynamic_cast(s,&Object::typeinfo,&Branch::typeinfo,0);
    if (b != (Branch *)0x0) {
      printDescription(this,b);
      return;
    }
    b_00 = (BranchIf *)__dynamic_cast(s,&Object::typeinfo,&BranchIf::typeinfo,0);
    if (b_00 != (BranchIf *)0x0) {
      printDescription(this,b_00);
      return;
    }
    lVar1 = __dynamic_cast(s,&Object::typeinfo,&ReturnVoid::typeinfo,0);
    if (lVar1 == 0) {
      r_00 = (ReturnValue *)__dynamic_cast(s,&Object::typeinfo,&ReturnValue::typeinfo,0);
      if (r_00 != (ReturnValue *)0x0) {
        printDescription(this,r_00);
        return;
      }
      throwInternalCompilerError("printStatementDescription",0x238);
    }
    this_00 = this->out;
    pcVar2 = "return";
    sVar3 = 6;
  }
  else {
    this_00 = this->out;
    pcVar2 = "advance";
    sVar3 = 7;
  }
  text._M_str = pcVar2;
  text._M_len = sVar3;
  choc::text::CodePrinter::writeBlock(this_00,text);
  return;
}

Assistant:

void printStatementDescription (const heart::Object& s)
        {
            #define SOUL_GET_STATEMENT_DESC(Type)     if (auto t = cast<const heart::Type> (s)) return printDescription (*t);
            SOUL_HEART_STATEMENTS (SOUL_GET_STATEMENT_DESC)
            SOUL_HEART_TERMINATORS (SOUL_GET_STATEMENT_DESC)

            SOUL_ASSERT_FALSE;
        }